

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libquat_quat.cpp
# Opt level: O1

quaternion operator/(quaternion *in_quat,float scalar)

{
  undefined1 auVar1 [16];
  quaternion qVar2;
  
  auVar1._4_4_ = scalar;
  auVar1._0_4_ = scalar;
  auVar1._8_4_ = scalar;
  auVar1._12_4_ = scalar;
  qVar2 = (quaternion)divps((undefined1  [16])*in_quat,auVar1);
  return qVar2;
}

Assistant:

quaternion operator/(const quaternion &in_quat, const float scalar) {
    quaternion temp = {0.f};

    temp.w = in_quat.q0 / scalar;
    temp.q1 = in_quat.q1 / scalar;
    temp.q2 = in_quat.q2 / scalar;
    temp.q3 = in_quat.q3 / scalar;

    return temp;
}